

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

int32_t __thiscall helics::EndpointInfo::getProperty(EndpointInfo *this,int32_t option)

{
  size_type sVar1;
  int in_ESI;
  long in_RDI;
  bool flagval;
  bool local_15;
  
  local_15 = false;
  if (in_ESI == 0x18d) {
    local_15 = (bool)(*(byte *)(in_RDI + 0x161) & 1);
  }
  else if (in_ESI == 0x192) {
    local_15 = (bool)((*(byte *)(in_RDI + 0x161) ^ 0xff) & 1);
  }
  else if (in_ESI == 0x197) {
    local_15 = *(int *)(in_RDI + 0x168) == 1;
  }
  else if (in_ESI == 0x199) {
    local_15 = *(int *)(in_RDI + 0x168) != 1;
  }
  else if (in_ESI == 0x1a6) {
    local_15 = (bool)(*(byte *)(in_RDI + 0x164) & 1);
  }
  else if (in_ESI == 0x1a7) {
    local_15 = (bool)(*(byte *)(in_RDI + 0x163) & 1);
  }
  else if (in_ESI == 0x20a) {
    sVar1 = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
            size((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  *)(in_RDI + 0xf0));
    return (int32_t)sVar1;
  }
  return (uint)(local_15 != false);
}

Assistant:

int32_t EndpointInfo::getProperty(int32_t option) const
{
    bool flagval = false;
    switch (option) {
        case defs::Options::CONNECTION_REQUIRED:
            flagval = required;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            flagval = !required;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            flagval = (requiredConnections == 1);
            break;
        case defs::Options::SEND_ONLY:
            flagval = sourceOnly;
            break;
        case defs::Options::RECEIVE_ONLY:
            flagval = receiveOnly;
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            flagval = (requiredConnections != 1);
            break;
        case defs::Options::CONNECTIONS:
            return static_cast<int32_t>(targetInformation.size());
        default:
            break;
    }
    return flagval ? 1 : 0;
}